

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtilsSystemSpecific.cpp
# Opt level: O0

string * ApprovalTests::FileUtilsSystemSpecific::getCommandLineForCopy
                   (string *source,string *destination,bool isWindows)

{
  byte in_CL;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  undefined1 local_179 [33];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [55];
  undefined1 local_c1 [33];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  
  local_19 = in_CL & 1;
  if (local_19 == 0) {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_179;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)(local_179 + 1),"cp ",(allocator *)pbVar1);
    ::std::operator+(in_stack_fffffffffffffe68,(char *)pbVar1);
    ::std::operator+(in_stack_fffffffffffffe68,pbVar1);
    ::std::operator+(in_stack_fffffffffffffe68,(char *)pbVar1);
    ::std::operator+(in_stack_fffffffffffffe68,pbVar1);
    ::std::operator+(in_stack_fffffffffffffe68,(char *)pbVar1);
    ::std::__cxx11::string::~string(local_f8);
    ::std::__cxx11::string::~string(local_118);
    ::std::__cxx11::string::~string(local_138);
    ::std::__cxx11::string::~string(local_158);
    ::std::__cxx11::string::~string((string *)(local_179 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_179);
  }
  else {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)(local_c1 + 1),"copy /Y ",(allocator *)pbVar1);
    ::std::operator+(pbVar1,(char *)in_stack_fffffffffffffe60);
    ::std::operator+(pbVar1,in_stack_fffffffffffffe60);
    ::std::operator+(pbVar1,(char *)in_stack_fffffffffffffe60);
    ::std::operator+(pbVar1,in_stack_fffffffffffffe60);
    ::std::operator+(pbVar1,(char *)in_stack_fffffffffffffe60);
    ::std::__cxx11::string::~string(local_40);
    ::std::__cxx11::string::~string(local_60);
    ::std::__cxx11::string::~string(local_80);
    ::std::__cxx11::string::~string(local_a0);
    ::std::__cxx11::string::~string((string *)(local_c1 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_c1);
  }
  return in_RDI;
}

Assistant:

std::string FileUtilsSystemSpecific::getCommandLineForCopy(
        const std::string& source, const std::string& destination, bool isWindows)
    {
        if (isWindows)
        {
            return std::string("copy /Y ") + "\"" + source + "\" \"" + destination + "\"";
        }
        else
        {
            return std::string("cp ") + "\"" + source + "\" \"" + destination + "\"";
        }
    }